

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>,_10>::~TPZManVector
          (TPZManVector<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>,_10> *this)

{
  ~TPZManVector(this);
  operator_delete(this,0x160);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}